

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.h
# Opt level: O0

void pybind11::detail::initimpl::construct<pybind11::class_<ki::protocol::control::Opcode>>
               (value_and_holder *v_h,Cpp<pybind11::class_<ki::protocol::control::Opcode>_> *result,
               bool need_alias)

{
  Cpp<pybind11::class_<ki::protocol::control::Opcode>_> *pCVar1;
  void **ppvVar2;
  bool need_alias_local;
  Cpp<pybind11::class_<ki::protocol::control::Opcode>_> *result_local;
  value_and_holder *v_h_local;
  
  pCVar1 = (Cpp<pybind11::class_<ki::protocol::control::Opcode>_> *)operator_new(1);
  *pCVar1 = *result;
  ppvVar2 = value_and_holder::value_ptr<void>(v_h);
  *ppvVar2 = pCVar1;
  return;
}

Assistant:

void construct(value_and_holder &v_h, Cpp<Class> &&result, bool need_alias) {
    static_assert(std::is_move_constructible<Cpp<Class>>::value,
        "pybind11::init() return-by-value factory function requires a movable class");
    if (Class::has_alias && need_alias)
        construct_alias_from_cpp<Class>(is_alias_constructible<Class>{}, v_h, std::move(result));
    else
        v_h.value_ptr() = new Cpp<Class>(std::move(result));
}